

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_filter.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  byte *__filename;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int __fd;
  size_t sVar4;
  clock_t cVar5;
  FILE *__stream;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  void *__addr;
  clock_t cVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  byte *__s;
  uint uVar14;
  char *pcVar15;
  size_t sVar16;
  uint8_t *block;
  uint64_t key;
  uint64_t local_120;
  uint64_t seed;
  clock_t local_110;
  uint64_t BlockLength;
  uint64_t cookie;
  binary_fuse16_t binfilter16;
  binary_fuse8_t binfilter;
  uint32_t digest [5];
  
  bVar2 = false;
  do {
    bVar11 = bVar2;
    iVar3 = getopt(argc,argv,"hs");
    bVar2 = true;
  } while (iVar3 == 0x73);
  if (iVar3 != -1) {
    iVar3 = 0;
    printf(" Try %s  filter.bin  7C4A8D09CA3762AF (use 16-hex-character keys)\n",*argv);
    pcVar15 = "Use the -s if you want to provide a string to be hashed (SHA1).";
    goto LAB_00101253;
  }
  if (argc <= _optind + 1) {
    printf(" Try %s  filter.bin  7C4A8D09CA3762AF (use 16-hex-character keys)\n",*argv);
    puts("Use the -s if you want to provide a string to be hashed (SHA1).");
    return -1;
  }
  __filename = (byte *)argv[_optind];
  printf("using database: %s\n",__filename);
  if (bVar11) {
    puts("We are going to hash your input.");
    binfilter.Seed = (uint64_t)&PTR__SHA1_00103da0;
    binfilter.SegmentLength = 0x67452301;
    binfilter.SegmentLengthMask = 0xefcdab89;
    binfilter.SegmentCount = 0x98badcfe;
    binfilter.SegmentCountLength = 0x10325476;
    binfilter.ArrayLength = 0xc3d2e1f0;
    pcVar15 = argv[(long)_optind + 1];
    sVar4 = strlen(pcVar15);
    printf("hashing this word: %s (length in bytes = %zu)\n",pcVar15,sVar4);
    sVar4 = strlen(pcVar15);
    if (sVar4 != 0) {
      sVar16 = 0;
      do {
        sha1::SHA1::processByte((SHA1 *)&binfilter,pcVar15[sVar16]);
        sVar16 = sVar16 + 1;
      } while (sVar4 != sVar16);
    }
    sha1::SHA1::getDigest((SHA1 *)&binfilter,digest);
    snprintf((char *)&binfilter16,0x2d,"%08x %08x %08x %08x %08x",digest._0_8_ & 0xffffffff,
             (ulong)digest._0_8_ >> 0x20,digest._8_8_ & 0xffffffff,(ulong)digest._8_8_ >> 0x20,
             stack0xffffffffffffffb8 & 0xffffffff);
    printf("SHA1 hash %s\n",&binfilter16);
    key = CONCAT44(digest[0],digest[1]);
  }
  else {
    __s = (byte *)argv[(long)_optind + 1];
    sVar4 = strlen((char *)__s);
    if (sVar4 != 0x10) {
      printf("bad hex. length is %zu, 16 hexadecimal characters expected.\n",sVar4);
      printf(" Try %s  filter.bin  7C4A8D09CA3762AF (use 16-hex-character keys)\n",*argv);
      puts("Use the -s if you want to provide a string to be hashed (SHA1).");
      return 1;
    }
    uVar6 = (long)digittoval[__s[2]] << 4 | (long)digittoval[__s[3]] |
            (long)digittoval[__s[1]] << 8 | (long)digittoval[*__s] << 0xc;
    uVar12 = (int)digittoval[__s[6]] << 4 | (int)digittoval[__s[7]] |
             (int)digittoval[__s[5]] << 8 | (int)digittoval[__s[4]] << 0xc;
    uVar13 = (int)digittoval[__s[10]] << 4 | (int)digittoval[__s[0xb]] |
             (int)digittoval[__s[9]] << 8 | (int)digittoval[__s[8]] << 0xc;
    uVar14 = (int)digittoval[__s[0xe]] << 4 | (int)digittoval[__s[0xf]] |
             (int)digittoval[__s[0xd]] << 8 | (int)digittoval[__s[0xc]] << 0xc;
    if (((uVar14 | uVar13 | uVar12 | (uint)uVar6) & 0xffff0000) != 0) {
      pcVar15 = "bad hex value  %s \n";
      goto LAB_00101975;
    }
    key = (ulong)uVar13 << 0x10 | (ulong)uVar12 << 0x20 | uVar6 << 0x30 | (ulong)uVar14;
  }
  printf("hexval = 0x%lx\n",key);
  cookie = 0;
  seed = 0;
  BlockLength = 0;
  cVar5 = clock();
  __stream = fopen((char *)__filename,"rb");
  if (__stream == (FILE *)0x0) {
    pcVar15 = "Cannot read the input file %s.";
    __s = __filename;
LAB_00101975:
    printf(pcVar15,__s);
    return 1;
  }
  sVar4 = fread(&cookie,8,1,__stream);
  if (sVar4 != 1) {
    puts("failed read.");
  }
  sVar4 = fread(&seed,8,1,__stream);
  if (sVar4 != 1) {
    puts("failed read.");
  }
  local_110 = cVar5;
  switch(cookie) {
  case 0x12d687:
    sVar4 = fread(&BlockLength,8,1,__stream);
    if (sVar4 != 1) {
      puts("failed read.");
    }
    local_120 = BlockLength;
    sVar4 = BlockLength * 3 + 0x18;
    bVar2 = true;
    pcVar15 = "Xor filter detected.";
    break;
  case 0x12d688:
    sVar4 = fread(&BlockLength,8,1,__stream);
    if (sVar4 != 1) {
      puts("failed read.");
    }
    local_120 = BlockLength;
    sVar4 = BlockLength * 8 + 0x18;
    bVar1 = true;
    pcVar15 = "Bloom filter detected.";
    bVar2 = false;
    bVar11 = false;
    goto LAB_00101859;
  case 0x12d689:
    binfilter.Seed = seed;
    sVar4 = fread(&binfilter.SegmentLength,4,1,__stream);
    sVar16 = fread(&binfilter.SegmentLengthMask,4,1,__stream);
    sVar7 = fread(&binfilter.SegmentCount,4,1,__stream);
    sVar8 = fread(&binfilter.SegmentCountLength,4,1,__stream);
    sVar9 = fread(&binfilter.ArrayLength,4,1,__stream);
    if (((uint)sVar9 & (uint)sVar8 & (uint)sVar7 & (uint)sVar16 & (uint)sVar4 & 1) == 0) {
      puts("failed read.");
    }
    sVar4 = (ulong)binfilter.ArrayLength + 0x24;
    pcVar15 = "8-bit binary fuse filter detected.";
    local_120 = 0;
    bVar2 = false;
    break;
  case 0x12d68a:
    binfilter16.Seed = seed;
    sVar4 = fread(&binfilter16.SegmentLength,4,1,__stream);
    sVar16 = fread(&binfilter16.SegmentLengthMask,4,1,__stream);
    sVar7 = fread(&binfilter16.SegmentCount,4,1,__stream);
    sVar8 = fread(&binfilter16.SegmentCountLength,4,1,__stream);
    sVar9 = fread(&binfilter16.ArrayLength,4,1,__stream);
    if (((uint)sVar9 & (uint)sVar8 & (uint)sVar7 & (uint)sVar16 & (uint)sVar4 & 1) == 0) {
      puts("failed read.");
    }
    sVar4 = (ulong)binfilter16.ArrayLength * 2 + 0x24;
    bVar11 = true;
    pcVar15 = "16-bit binary fuse filter detected.";
    local_120 = 0;
    bVar2 = false;
    goto LAB_00101800;
  default:
    pcVar15 = "Not a filter file. Cookie found: %llu.\n";
    __s = (byte *)cookie;
    goto LAB_00101975;
  }
  bVar11 = false;
LAB_00101800:
  bVar1 = false;
LAB_00101859:
  puts(pcVar15);
  fclose(__stream);
  __fd = open((char *)__filename,0);
  printf("I expect the file to span %zu bytes.\n",sVar4);
  iVar3 = 1;
  __addr = mmap((void *)0x0,sVar4,1,2,__fd,0);
  if (__addr != (void *)0xffffffffffffffff) {
    puts("memory mapping is a success.");
    cVar5 = local_110;
    if (bVar1) {
      digest._8_8_ = (long)__addr + 0x18;
      digest[0] = (undefined4)local_120;
      digest[1] = local_120._4_4_;
      stack0xffffffffffffffb8 = seed;
      bVar2 = MappeableBloomFilter<12>::Contain((MappeableBloomFilter<12> *)digest,key);
      pcVar15 = "Surely not in the set.";
      if (bVar2) {
        pcVar15 = "Probably in the set.";
      }
      puts(pcVar15);
      cVar5 = local_110;
    }
    else {
      if (bVar2) {
        digest[0] = (undefined4)seed;
        digest[1] = seed._4_4_;
        digest[2] = (undefined4)local_120;
        digest[3] = local_120._4_4_;
        register0x00000000 = (long)__addr + 0x18;
        bVar2 = xor8_contain(key,(xor8_t *)digest);
        pcVar15 = "Surely not in the set.";
        if (bVar2) {
          pcVar15 = "Probably in the set.";
        }
      }
      else {
        if (bVar11) {
          binfilter16.Fingerprints = (uint16_t *)((long)__addr + 0x24);
          bVar2 = binary_fuse16_contain(key,&binfilter16);
        }
        else {
          binfilter.Fingerprints = (uint8_t *)((long)__addr + 0x24);
          bVar2 = binary_fuse8_contain(key,&binfilter);
        }
        if (bVar2 == false) {
          pcVar15 = "Surely not in the set.";
        }
        else {
          pcVar15 = "Probably in the set.";
        }
      }
      puts(pcVar15);
    }
    cVar10 = clock();
    local_110 = CONCAT44(local_110._4_4_,(float)(cVar10 - cVar5));
    printf("Processing time %.3f microseconds.\n",
           SUB84(((double)(cVar10 - cVar5) * 1000.0 * 1000.0) / 1000000.0,0));
    printf("Expected number of queries per second: %.3f \n",
           SUB84((double)(1e+06 / (float)local_110),0));
    munmap(__addr,sVar4);
    return 0;
  }
  pcVar15 = "Data can\'t be mapped???";
LAB_00101253:
  puts(pcVar15);
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
  int c;
  bool shaourinput = false;
  while ((c = getopt(argc, argv, "hs")) != -1)
    switch (c) {
    case 'h':
      printusage(argv[0]);
      return 0;
    case 's':
      shaourinput = true;
      break;
    default:
      printusage(argv[0]);
      return 0;
    }
  if (optind + 1 >= argc) {
    printusage(argv[0]);
    return -1;
  }
  const char *filename = argv[optind];
  printf("using database: %s\n", filename);
  uint64_t hexval;
  if (shaourinput) {
    printf("We are going to hash your input.\n");
    sha1::SHA1 s;
    const char *tobehashed = argv[optind + 1];
    printf("hashing this word: %s (length in bytes = %zu)\n", tobehashed,
           strlen(tobehashed));
    s.processBytes(tobehashed, strlen(tobehashed));
    uint32_t digest[5];
    s.getDigest(digest);
    char tmp[48];
    snprintf(tmp, 45, "%08x %08x %08x %08x %08x", digest[0], digest[1],
             digest[2], digest[3], digest[4]);
    printf("SHA1 hash %s\n", tmp);
    hexval = ((uint64_t)digest[0] << 32) | digest[1];
  } else {
    const char *hashhex = argv[optind + 1];
    if (strlen(hashhex) != 16) {
      printf("bad hex. length is %zu, 16 hexadecimal characters expected.\n", strlen(hashhex));
      printusage(argv[0]);
      return EXIT_FAILURE;
    }
    uint64_t x1 = hex_to_u32_nocheck((const uint8_t *)hashhex);
    uint64_t x2 = hex_to_u32_nocheck((const uint8_t *)hashhex + 4);
    uint64_t x3 = hex_to_u32_nocheck((const uint8_t *)hashhex + 8);
    uint64_t x4 = hex_to_u32_nocheck((const uint8_t *)hashhex + 12);
    if ((x1 | x2 | x3 | x4) > 0xFFFF) {
      printf("bad hex value  %s \n", hashhex);
      return EXIT_FAILURE;
    }
    hexval = (x1 << 48) | (x2 << 32) | (x3 << 16) | x4;
  }
  printf("hexval = 0x%" PRIx64 "\n", hexval);
  uint64_t cookie = 0;

  uint64_t seed = 0;
  uint64_t BlockLength = 0;
  clock_t start = clock();

  // could open the file once (map it), instead of this complicated mess.
  FILE *fp = fopen(filename, "rb");
  if (fp == NULL) {
    printf("Cannot read the input file %s.", filename);
    return EXIT_FAILURE;
  }
  // should be done with an enum:
  bool xor8 = false;
  bool bin16 = false;
  bool bloom12 = false;
  if (fread(&cookie, sizeof(cookie), 1, fp) != 1)
    printf("failed read.\n");
  if (fread(&seed, sizeof(seed), 1, fp) != 1)
    printf("failed read.\n");
  // should be a switch/case.
  if (cookie != 1234569) {
    if(cookie == 1234570) {
      bin16 = true;
    } else  if (cookie == 1234567) {
      xor8 = true;
      if (fread(&BlockLength, sizeof(BlockLength), 1, fp) != 1)
        printf("failed read.\n");

    } else if (cookie == 1234567 + 1) {
      bloom12 = true;
      if (fread(&BlockLength, sizeof(BlockLength), 1, fp) != 1)
        printf("failed read.\n");

    } else {
      printf("Not a filter file. Cookie found: %llu.\n", (long long unsigned int)cookie);
      return EXIT_FAILURE;
    }
  }
  size_t length = 0;
  binary_fuse8_t binfilter;
  binary_fuse16_t binfilter16;

  if (bloom12) {
    length = BlockLength * sizeof(uint64_t) + 3 * sizeof(uint64_t);
  } else if (xor8) {
    length = 3 * BlockLength * sizeof(uint8_t) + 3 * sizeof(uint64_t);
  } else if(bin16) {
    bool isok = true;
    binfilter16.Seed = seed;
    isok &=
        fread(&binfilter16.SegmentLength, sizeof(binfilter16.SegmentLength), 1, fp);
    isok &=
        fread(&binfilter16.SegmentLengthMask, sizeof(binfilter16.SegmentLengthMask), 1, fp);
    isok &=
        fread(&binfilter16.SegmentCount, sizeof(binfilter16.SegmentCount), 1, fp);
    isok &= fread(&binfilter16.SegmentCountLength,
                  sizeof(binfilter16.SegmentCountLength), 1, fp);
    isok &= fread(&binfilter16.ArrayLength, sizeof(binfilter16.ArrayLength), 1, fp);
    if (!isok)
      printf("failed read.\n");
    length =
        sizeof(cookie) + sizeof(binfilter16.Seed) +
        sizeof(binfilter16.SegmentLength) + sizeof(binfilter16.SegmentLengthMask) +
        sizeof(binfilter16.SegmentCount) + sizeof(binfilter16.SegmentCountLength) +
        sizeof(binfilter16.ArrayLength) + sizeof(uint16_t) * binfilter16.ArrayLength;

  } else {
    bool isok = true;
    binfilter.Seed = seed;
    isok &=
        fread(&binfilter.SegmentLength, sizeof(binfilter.SegmentLength), 1, fp);
    isok &=
        fread(&binfilter.SegmentLengthMask, sizeof(binfilter.SegmentLengthMask), 1, fp);
    isok &=
        fread(&binfilter.SegmentCount, sizeof(binfilter.SegmentCount), 1, fp);
    isok &= fread(&binfilter.SegmentCountLength,
                  sizeof(binfilter.SegmentCountLength), 1, fp);
    isok &= fread(&binfilter.ArrayLength, sizeof(binfilter.ArrayLength), 1, fp);
    if (!isok)
      printf("failed read.\n");
    length =
        sizeof(cookie) + sizeof(binfilter.Seed) +
        sizeof(binfilter.SegmentLength) + sizeof(binfilter.SegmentLengthMask) +
        sizeof(binfilter.SegmentCount) + sizeof(binfilter.SegmentCountLength) +
        sizeof(binfilter.ArrayLength) + sizeof(uint8_t) * binfilter.ArrayLength;
  }

  if (bloom12)
    printf("Bloom filter detected.\n");
  else if (xor8)
    printf("Xor filter detected.\n");
  else if(bin16)
    printf("16-bit binary fuse filter detected.\n");
  else
    printf("8-bit binary fuse filter detected.\n");
  fclose(fp);
  int fd = open(filename, O_RDONLY);
  bool shared = false;

  printf("I expect the file to span %zu bytes.\n", length);
// for Linux:
#if defined(__linux__) && defined(USE_POPULATE)
  uint8_t *addr = (uint8_t *)(mmap(
      NULL, length, PROT_READ,
      MAP_FILE | (shared ? MAP_SHARED : MAP_PRIVATE) | MAP_POPULATE, fd, 0));
#else
  uint8_t *addr =
      (uint8_t *)(mmap(NULL, length, PROT_READ,
                       MAP_FILE | (shared ? MAP_SHARED : MAP_PRIVATE), fd, 0));
#endif
  if (addr == MAP_FAILED) {
    printf("Data can't be mapped???\n");
    return EXIT_FAILURE;
  } else {
    printf("memory mapping is a success.\n");
  }
  if (bloom12) {
    MappeableBloomFilter<12> filter(
        BlockLength, seed, (const uint64_t *)(addr + 3 * sizeof(uint64_t)));
    if (filter.Contain(hexval)) {
      printf("Probably in the set.\n");
    } else {
      printf("Surely not in the set.\n");
    }
  } else if (xor8) {
    xor8_t filter;
    filter.seed = seed;
    filter.blockLength = BlockLength;
    filter.fingerprints = addr + 3 * sizeof(uint64_t);
    if (xor8_contain(hexval, &filter)) {
      printf("Probably in the set.\n");
    } else {
      printf("Surely not in the set.\n");
    }
  } else if (bin16) {
    binfilter16.Fingerprints = reinterpret_cast<uint16_t*>(
        addr + sizeof(cookie) + sizeof(binfilter16.Seed) +
        sizeof(binfilter16.SegmentLength) + sizeof(binfilter16.SegmentLengthMask) +
        sizeof(binfilter16.SegmentCount) + sizeof(binfilter16.SegmentCountLength) +
        sizeof(binfilter16.ArrayLength));
    if (binary_fuse16_contain(hexval, &binfilter16)) {
      printf("Probably in the set.\n");
    } else {
      printf("Surely not in the set.\n");
    }
  } else {
    binfilter.Fingerprints =
        addr + sizeof(cookie) + sizeof(binfilter.Seed) +
        sizeof(binfilter.SegmentLength) + sizeof(binfilter.SegmentLengthMask) +
        sizeof(binfilter.SegmentCount) + sizeof(binfilter.SegmentCountLength) +
        sizeof(binfilter.ArrayLength);
    if (binary_fuse8_contain(hexval, &binfilter)) {
      printf("Probably in the set.\n");
    } else {
      printf("Surely not in the set.\n");
    }
  }
  clock_t end = clock();

  printf("Processing time %.3f microseconds.\n",
         (float)(end - start) * 1000.0 * 1000.0 / CLOCKS_PER_SEC);
  printf("Expected number of queries per second: %.3f \n",
         (float)CLOCKS_PER_SEC / (end - start));
  munmap(addr, length);
  return EXIT_SUCCESS;
}